

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O3

void __thiscall
TPZBlockDiagonal<float>::UpdateFrom
          (TPZBlockDiagonal<float> *this,TPZAutoPointer<TPZMatrix<float>_> *mat)

{
  long lVar1;
  TPZMatrix<float> *pTVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  TPZFMatrix<float> block;
  TPZFMatrix<float> local_c0;
  
  if ((mat->fRef != (TPZReference *)0x0) && (mat->fRef->fPointer != (TPZMatrix<float> *)0x0)) {
    (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fDecomposed = '\0';
    lVar1 = (this->fBlockSize).fNElements;
    if (0 < lVar1) {
      lVar3 = 0;
      lVar5 = 0;
      do {
        lVar4 = (long)(this->fBlockSize).fStore[lVar3];
        local_c0.fElem = (this->fStorage).fStore + (this->fBlockPos).fStore[lVar3];
        local_c0.fSize = lVar4 * lVar4;
        local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
        local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
        local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             (_func_int **)&PTR__TPZFMatrix_0181dbe8;
        local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = lVar4;
        local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = lVar4;
        local_c0.fGiven = local_c0.fElem;
        TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
        local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
        local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
        local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
        local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
        local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813d70;
        local_c0.fWork.fStore = (float *)0x0;
        local_c0.fWork.fNElements = 0;
        local_c0.fWork.fNAlloc = 0;
        if (lVar4 == 0) {
          local_c0.fElem = (float *)0x0;
        }
        pTVar2 = mat->fRef->fPointer;
        (*(pTVar2->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x2f])
                  (pTVar2,lVar5,lVar5,lVar4,lVar4,&local_c0);
        lVar5 = lVar5 + lVar4;
        TPZFMatrix<float>::~TPZFMatrix(&local_c0);
        lVar3 = lVar3 + 1;
      } while (lVar1 != lVar3);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"TPZBlockDiagonal::UpdateFrom",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," called with zero argument\n",0x1b);
  return;
}

Assistant:

void TPZBlockDiagonal<TVar>::UpdateFrom(TPZAutoPointer<TPZMatrix<TVar> > mat)
{
	if(!mat) 
	{
		cout << "TPZBlockDiagonal::UpdateFrom" << " called with zero argument\n";
		return;
	}
	this->fDecomposed = ENoDecompose;
	int64_t nblock = fBlockSize.NElements();
	int64_t b,bsize,pos,firsteq = 0;
	for(b=0; b<nblock; b++) {
		bsize = fBlockSize[b];
		//    int r,c;
		pos = fBlockPos[b];
		TPZFMatrix<TVar> block(bsize,bsize,&fStorage[pos],bsize*bsize);
		mat->GetSub(firsteq,firsteq,bsize,bsize,block);
		firsteq += bsize;
	}
}